

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<float,float,1>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>,3,2>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
                 (redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                  *eval,scalar_max_op<float,_float,_1> *func,
                 CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                 *xpr)

{
  bool bVar1;
  CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  *pCVar2;
  Index IVar3;
  result_type rVar4;
  undefined4 extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float afVar5 [4];
  Scalar local_3c;
  float local_38 [4];
  result_type local_24;
  CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  *pCStack_20;
  Scalar res;
  CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
  *xpr_local;
  scalar_max_op<float,_float,_1> *func_local;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
  *eval_local;
  
  pCStack_20 = xpr;
  xpr_local = (CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
               *)func;
  func_local = (scalar_max_op<float,_float,_1> *)eval;
  IVar3 = CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
          ::rows(xpr);
  bVar1 = false;
  if (0 < IVar3) {
    IVar3 = CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
            ::cols(pCStack_20);
    bVar1 = false;
    if (0 < IVar3) {
      bVar1 = true;
    }
  }
  pCVar2 = xpr_local;
  if (!bVar1) {
    __assert_fail("xpr.rows()>0 && xpr.cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                  ,0x156,
                  "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_max_op<float, float, 1>, Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>, const Eigen::Matrix<float, 3, 3>>>>::run(const Evaluator &, const Func &, const XprType &) [Func = Eigen::internal::scalar_max_op<float, float, 1>, Evaluator = Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>, const Eigen::Matrix<float, 3, 3>>>, Traversal = 3, Unrolling = 2, XprType = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>, const Eigen::Matrix<float, 3, 3>>]"
                 );
  }
  afVar5 = redux_vec_unroller<Eigen::internal::scalar_max_op<float,float,1>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>,0,2>
           ::run<float__vector(4)>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                       *)func_local,(scalar_max_op<float,_float,_1> *)xpr_local);
  local_38[2] = (float)extraout_XMM0_Dc;
  local_38[0] = (float)(int)afVar5._0_8_;
  local_38[1] = (float)(int)((ulong)afVar5._0_8_ >> 0x20);
  local_38[3] = extraout_XMM0_Dd;
  local_24 = scalar_max_op<float,float,1>::predux<float__vector(4)>
                       ((scalar_max_op<float,float,1> *)pCVar2,&local_38);
  pCVar2 = xpr_local;
  local_3c = redux_novec_unroller<Eigen::internal::scalar_max_op<float,_float,_1>,_Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_8,_1>
             ::run((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                    *)func_local,(scalar_max_op<float,_float,_1> *)xpr_local);
  rVar4 = scalar_max_op<float,_float,_1>::operator()
                    ((scalar_max_op<float,_float,_1> *)pCVar2,&local_24,&local_3c);
  return rVar4;
}

Assistant:

EIGEN_DEVICE_FUNC static EIGEN_STRONG_INLINE
  Scalar run(const Evaluator &eval, const Func& func, const XprType &xpr)
  {
    EIGEN_ONLY_USED_FOR_DEBUG(xpr)
    eigen_assert(xpr.rows()>0 && xpr.cols()>0 && "you are using an empty matrix");
    if (VectorizedSize > 0) {
      Scalar res = func.predux(redux_vec_unroller<Func, Evaluator, 0, Size / PacketSize>::template run<PacketType>(eval,func));
      if (VectorizedSize != Size)
        res = func(res,redux_novec_unroller<Func, Evaluator, VectorizedSize, Size-VectorizedSize>::run(eval,func));
      return res;
    }
    else {
      return redux_novec_unroller<Func, Evaluator, 0, Size>::run(eval,func);
    }
  }